

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O2

void __thiscall
Imf_3_2::SampleCountChannel::SampleCountChannel(SampleCountChannel *this,DeepImageLevel *level)

{
  ImageChannel::ImageChannel(&this->super_ImageChannel,&level->super_ImageLevel,1,1,false);
  (this->super_ImageChannel)._vptr_ImageChannel = (_func_int **)&PTR_pixelType_00128c60;
  this->_numSamples = (uint *)0x0;
  this->_base = (uint *)0x0;
  this->_sampleListSizes = (uint *)0x0;
  this->_sampleListPositions = (size_t *)0x0;
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  this->_sampleBufferSize = 0;
  resize(this);
  return;
}

Assistant:

SampleCountChannel::SampleCountChannel (DeepImageLevel& level)
    : ImageChannel (level, 1, 1, false)
    , _numSamples (0)
    , _base (0)
    , _sampleListSizes (0)
    , _sampleListPositions (0)
    , _totalNumSamples (0)
    , _totalSamplesOccupied (0)
    , _sampleBufferSize (0)
{
    resize ();
}